

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint64_t uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  secp256k1_scalar sVar10;
  ulong uVar11;
  FILE *__stream;
  size_t sVar12;
  secp256k1_ge *psVar13;
  secp256k1_gej *psVar14;
  int *piVar15;
  secp256k1_context *ctx;
  secp256k1_scratch *scratch;
  size_t sVar16;
  secp256k1_scalar *psVar17;
  secp256k1_ge *psVar18;
  long lVar19;
  time_t tVar20;
  undefined4 uVar21;
  uint64_t uVar22;
  secp256k1_fe *psVar23;
  void *pvVar24;
  void *pvVar25;
  secp256k1_gej *psVar26;
  int j;
  uint uVar27;
  long lVar28;
  secp256k1_gej *gen;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *psVar29;
  secp256k1_gej *extraout_RDX_00;
  ulong uVar30;
  char *pcVar31;
  int iVar32;
  uint uVar33;
  secp256k1_ge *a;
  uint64_t *puVar34;
  uchar *output32;
  int iVar35;
  uint uVar36;
  char **ppcVar37;
  secp256k1_xonly_pubkey *pubkey;
  uint64_t *puVar38;
  secp256k1_callback *error_callback;
  ulong *n_points;
  ulong *puVar39;
  char *pcVar40;
  ulong uVar41;
  int pos;
  uint uVar42;
  long lVar43;
  secp256k1_ge_storage (*pasVar44) [16];
  size_t sVar45;
  long lVar46;
  ulong uVar47;
  bool bVar48;
  byte bVar49;
  undefined1 auVar50 [16];
  undefined8 uStack_1b00;
  secp256k1_fe *local_1af0;
  long local_1ae8;
  secp256k1_ge *local_1ae0;
  long local_1ad8;
  secp256k1_ge *local_1ac0;
  long local_1ab0;
  int local_1aa4;
  char **local_1aa0;
  ulong local_1a98;
  uint64_t iter_5;
  secp256k1_scalar g_sc;
  undefined4 uStack_1a84;
  uint64_t uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  secp256k1_scalar sStack_1a5c;
  uint64_t iter_1;
  secp256k1_ge *psStack_1a50;
  secp256k1_strauss_point_state *local_1a48;
  uint64_t uStack_1a40;
  uint64_t local_1a38;
  undefined8 uStack_1a30;
  undefined4 local_1a28;
  uint64_t local_1a20;
  uint64_t local_1a18;
  secp256k1_scalar e;
  uint64_t iter_2;
  uint64_t uStack_1a00;
  int local_19f8;
  undefined4 uStack_19f4;
  undefined4 uStack_19f0;
  undefined4 uStack_19ec;
  undefined4 local_19e8;
  undefined4 uStack_19e4;
  int iStack_19e0;
  int iStack_19dc;
  long local_19d8;
  uint64_t local_19d0;
  secp256k1_scalar expected_r;
  uint64_t uStack_19c0;
  uint64_t local_19b8;
  uint64_t uStack_19b0;
  secp256k1_schnorrsig_extraparams extraparams;
  int local_1988;
  uint64_t iter;
  void *pvStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  uchar local_1938 [24];
  uint64_t uStack_1920;
  uchar rand32 [32];
  secp256k1_fe nums_x;
  secp256k1_fe local_1788;
  int local_1758;
  uint64_t local_14d8 [2];
  int aiStack_14c8 [4];
  secp256k1_scalar scalar_i;
  undefined4 uStack_14b4;
  uint64_t uStack_14b0;
  uchar local_14a8 [8];
  undefined8 uStack_14a0;
  uchar local_1498 [4];
  uchar auStack_1494 [4];
  int iStack_1490;
  int iStack_148c;
  secp256k1_ge nums_ge;
  uint64_t local_1148 [130];
  secp256k1_ge group [13];
  undefined1 auStack_7f0 [8];
  secp256k1_gej groupj [13];
  
  bVar49 = 0;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (argc < 2) {
    uVar11 = (ulong)(uint)count;
  }
  else {
    uVar11 = strtol(argv[1],(char **)0x0,0);
    count = (int)uVar11;
  }
  printf("test count = %i\n",uVar11);
  local_1aa0 = argv;
  if (2 < argc) {
    pcVar31 = argv[2];
    nums_ge.x.n[0] = 0;
    nums_ge.x.n[1] = 0;
    if ((pcVar31 != (char *)0x0) && (*pcVar31 != '\0')) {
      lVar43 = 0;
      while ((((lVar43 != 0x10 && (pcVar40 = pcVar31 + lVar43 * 2, *pcVar40 != '\0')) &&
              (pcVar40[1] != '\0')) && (iVar7 = __isoc99_sscanf(pcVar40,"%2hx",groupj), iVar7 == 1))
            ) {
        *(undefined1 *)((long)nums_ge.x.n + lVar43) = (undefined1)groupj[0].x.n[0];
        lVar43 = lVar43 + 1;
      }
      goto LAB_0010a3b3;
    }
  }
  nums_ge.x.n[0] = 0;
  nums_ge.x.n[1] = 0;
  __stream = fopen("/dev/urandom","rb");
  if (__stream == (FILE *)0x0) {
    uVar22 = 0;
LAB_0010c355:
    tVar20 = time((time_t *)0x0);
    fwrite("WARNING: could not read 16 bytes from /dev/urandom; falling back to insecure PRNG\n",
           0x52,1,_stderr);
    uVar11 = tVar20 * 0x539;
    nums_ge.x.n[0] =
         (uVar11 & 0xffffffff | (uVar11 >> 0x20 & 0xffff) << 0x20 |
         (ulong)(ushort)((ushort)(byte)(uVar11 >> 0x38) << 8 | (ushort)(uVar11 >> 0x30) & 0xff) <<
         0x30) ^ uVar22;
    if (__stream == (FILE *)0x0) goto LAB_0010a3b3;
  }
  else {
    sVar12 = fread(&nums_ge,1,0x10,__stream);
    if (sVar12 != 0x10) {
      uVar22 = nums_ge.x.n[0];
      goto LAB_0010c355;
    }
  }
  fclose(__stream);
LAB_0010a3b3:
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         (ulong)(byte)nums_ge.x.n[0],(ulong)nums_ge.x.n[0]._1_1_);
  groupj[0].x.n[0] = 0xbb67ae856a09e667;
  groupj[0].x.n[1] = 0xa54ff53a3c6ef372;
  groupj[0].x.n[2] = 0x9b05688c510e527f;
  groupj[0].x.n[3] = 0x5be0cd191f83d9ab;
  groupj[0].z.n[0] = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)&nums_ge,0x10);
  psVar13 = group;
  secp256k1_sha256_finalize((secp256k1_sha256 *)groupj,(uchar *)psVar13);
  ppcVar37 = local_1aa0;
  for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
    uVar22 = 0;
    for (lVar28 = 0; lVar28 != 8; lVar28 = lVar28 + 1) {
      uVar22 = uVar22 << 8 | (ulong)*(byte *)((long)(psVar13->x).n + lVar28);
    }
    secp256k1_test_state[lVar43] = uVar22;
    psVar13 = (secp256k1_ge *)((psVar13->x).n + 1);
  }
  if (4 < argc) {
    lVar43 = strtol(local_1aa0[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar43;
    uVar11 = strtol(ppcVar37[4],(char **)0x0,0);
    this_core = (uint32_t)uVar11;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
      fprintf(_stderr,"Usage: %s [count] [seed] [numcores] [thiscore]\n",*ppcVar37);
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar11 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar13 = (secp256k1_ge *)checked_malloc(&default_error_callback,0x1a000);
  secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
  iVar7 = secp256k1_fe_set_b32_limit(&nums_x,(uchar *)"The scalar for this x is unknown");
  if (iVar7 == 0) {
    pcVar31 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_gen_compute_table_impl.h"
    ;
    pcVar40 = "test condition failed: r";
LAB_0010c676:
    uStack_1b00 = 0x27;
  }
  else {
    iVar7 = secp256k1_ge_set_xo_var(&nums_ge,&nums_x,0);
    if (iVar7 == 0) {
      pcVar31 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_gen_compute_table_impl.h"
      ;
      pcVar40 = "test condition failed: r";
      uStack_1b00 = 0x2a;
    }
    else {
      secp256k1_gej_set_ge((secp256k1_gej *)group,&nums_ge);
      psVar23 = (secp256k1_fe *)0x0;
      secp256k1_gej_add_ge_var
                ((secp256k1_gej *)group,(secp256k1_gej *)group,&secp256k1_ge_const_g,
                 (secp256k1_fe *)0x0);
      psVar14 = (secp256k1_gej *)checked_malloc(&default_error_callback,0x26000);
      memcpy(&nums_ge,groupj,0x98);
      memcpy(&nums_x,(secp256k1_gej *)group,0x98);
      psVar29 = psVar14;
      for (lVar43 = 0; lVar43 != 0x40; lVar43 = lVar43 + 1) {
        memcpy(psVar14 + lVar43 * 0x10,&nums_x,0x98);
        lVar28 = 0xf;
        psVar26 = psVar29;
        while (bVar48 = lVar28 != 0, lVar28 = lVar28 + -1, bVar48) {
          secp256k1_gej_add_var(psVar26 + 1,psVar26,(secp256k1_gej *)&nums_ge,psVar23);
          psVar26 = psVar26 + 1;
        }
        iVar7 = 4;
        while (bVar48 = iVar7 != 0, iVar7 = iVar7 + -1, bVar48) {
          secp256k1_gej_double_var
                    ((secp256k1_gej *)&nums_ge,(secp256k1_gej *)&nums_ge,(secp256k1_fe *)0x0);
        }
        secp256k1_gej_double_var
                  ((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x,(secp256k1_fe *)0x0);
        if (lVar43 == 0x3e) {
          secp256k1_gej_neg((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x,(secp256k1_gej *)group,
                     psVar23);
        }
        psVar29 = psVar29 + 0x10;
      }
      lVar43 = -1;
      lVar46 = 0;
      psVar18 = psVar13;
      for (lVar28 = 0; lVar28 != 0x400; lVar28 = lVar28 + 1) {
        secp256k1_gej_verify((secp256k1_gej *)((long)(psVar14->x).n + lVar46));
        if (*(int *)((long)(&psVar14->z + 1) + lVar46) == 0) {
          if (lVar43 == -1) {
            puVar34 = (uint64_t *)((long)(psVar14->z).n + lVar46);
            uVar22 = *puVar34;
            uVar6 = puVar34[1];
            puVar1 = (undefined4 *)((long)(psVar14->z).n + lVar46 + 0x10);
            uVar21 = *puVar1;
            uVar2 = puVar1[1];
            uVar3 = puVar1[2];
            uVar4 = puVar1[3];
            puVar1 = (undefined4 *)((long)(psVar14->z).n + lVar46 + 0x20);
            uVar5 = puVar1[1];
            iVar7 = puVar1[2];
            iVar35 = puVar1[3];
            *(undefined4 *)((psVar18->x).n + 4) = *puVar1;
            *(undefined4 *)((long)(psVar18->x).n + 0x24) = uVar5;
            (psVar18->x).magnitude = iVar7;
            (psVar18->x).normalized = iVar35;
            *(undefined4 *)((psVar18->x).n + 2) = uVar21;
            *(undefined4 *)((long)(psVar18->x).n + 0x14) = uVar2;
            *(undefined4 *)((psVar18->x).n + 3) = uVar3;
            *(undefined4 *)((long)(psVar18->x).n + 0x1c) = uVar4;
            (psVar18->x).n[0] = uVar22;
            (psVar18->x).n[1] = uVar6;
            lVar43 = lVar28;
          }
          else {
            secp256k1_fe_mul(&psVar18->x,&psVar13[lVar43].x,
                             (secp256k1_fe *)((long)(psVar14->z).n + lVar46));
            lVar43 = lVar28;
          }
        }
        else {
          secp256k1_ge_set_infinity(psVar18);
        }
        psVar18 = psVar18 + 1;
        lVar46 = lVar46 + 0x98;
      }
      if (lVar43 != -1) {
        secp256k1_fe_inv_var((secp256k1_fe *)&scalar_i,&psVar13[lVar43].x);
LAB_0010a783:
        lVar28 = -lVar43;
        psVar18 = psVar13 + lVar43;
        piVar15 = &psVar14[lVar43 + -1].infinity;
LAB_0010a799:
        lVar28 = lVar28 + 1;
        if (lVar28 != 1) goto code_r0x0010a7a2;
        if (psVar14[lVar43].infinity == 0) {
          psVar23 = &psVar13[lVar43].x;
          *(uchar (*) [4])(psVar23->n + 4) = local_1498;
          *(uchar (*) [4])((long)psVar23->n + 0x24) = auStack_1494;
          *(int *)(psVar23->n + 4 + 1) = iStack_1490;
          psVar23->normalized = iStack_148c;
          psVar23 = &psVar13[lVar43].x;
          *(undefined4 *)(psVar23->n + 2) = local_14a8._0_4_;
          *(undefined4 *)((long)psVar23->n + 0x14) = local_14a8._4_4_;
          *(undefined4 *)(psVar23->n + 2 + 1) = (undefined4)uStack_14a0;
          *(undefined4 *)((long)psVar23->n + 0x1c) = uStack_14a0._4_4_;
          psVar13[lVar43].x.n[0] = _scalar_i;
          psVar13[lVar43].x.n[1] = uStack_14b0;
          psVar29 = psVar14;
          for (lVar43 = 0; lVar43 != 0x1a000; lVar43 = lVar43 + 0x68) {
            if (psVar29->infinity == 0) {
              psVar18 = (secp256k1_ge *)((long)(psVar13->x).n + lVar43);
              secp256k1_ge_set_gej_zinv(psVar18,psVar29,(secp256k1_fe *)psVar18);
            }
            secp256k1_ge_verify((secp256k1_ge *)((long)(psVar13->x).n + lVar43));
            psVar29 = psVar29 + 1;
          }
          goto LAB_0010a857;
        }
        pcVar31 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/group_impl.h"
        ;
        pcVar40 = "test condition failed: !a[last_i].infinity";
        uStack_1b00 = 0xd5;
        goto LAB_0010c33a;
      }
LAB_0010a857:
      free(psVar14);
      pasVar44 = secp256k1_ecmult_gen_prec_table;
      psVar18 = psVar13;
      for (lVar43 = 0; lVar43 != 0x40; lVar43 = lVar43 + 1) {
        a = psVar18;
        for (lVar28 = 0; lVar28 != 0x400; lVar28 = lVar28 + 0x40) {
          secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(*pasVar44)[0].x.n + lVar28),a);
          a = a + 1;
        }
        pasVar44 = pasVar44 + 1;
        psVar18 = psVar18 + 0x10;
      }
      free(psVar13);
      secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
      secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)groupj,gen);
      iVar7 = 0x80;
      psVar29 = extraout_RDX;
      while (bVar48 = iVar7 != 0, iVar7 = iVar7 + -1, bVar48) {
        secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
        psVar29 = extraout_RDX_00;
      }
      secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)groupj,psVar29);
      while( true ) {
        bVar48 = count == 0;
        count = count + -1;
        if (bVar48) {
          secp256k1_testrand256((uchar *)&nums_ge);
          printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
                 (ulong)(byte)nums_ge.x.n[0],(ulong)nums_ge.x.n[0]._1_1_,(ulong)nums_ge.x.n[0]._2_1_
                 ,(ulong)nums_ge.x.n[0]._3_1_,(ulong)nums_ge.x.n[0]._4_1_,
                 (ulong)nums_ge.x.n[0]._5_1_,(ulong)nums_ge.x.n[0]._6_1_,(ulong)nums_ge.x.n[0]._7_1_
                 ,(ulong)(byte)nums_ge.x.n[1],(ulong)nums_ge.x.n[1]._1_1_,
                 (ulong)nums_ge.x.n[1]._2_1_,(ulong)nums_ge.x.n[1]._3_1_,(ulong)nums_ge.x.n[1]._4_1_
                 ,(ulong)nums_ge.x.n[1]._5_1_,(ulong)nums_ge.x.n[1]._6_1_,
                 (ulong)nums_ge.x.n[1]._7_1_);
          puts("no problems found");
          return 0;
        }
        iVar35 = 1;
        ctx = secp256k1_context_create(1);
        secp256k1_testrand256(rand32);
        iVar7 = secp256k1_context_randomize(ctx,rand32);
        if (iVar7 == 0) break;
        secp256k1_gej_set_infinity(groupj);
        secp256k1_ge_set_gej(group,groupj);
        psVar29 = groupj;
        for (lVar43 = -0x4e0; lVar43 != 0; lVar43 = lVar43 + 0x68) {
          psVar14 = psVar29 + 1;
          secp256k1_gej_add_ge(psVar14,psVar29,&secp256k1_ge_const_g);
          secp256k1_ge_set_gej((secp256k1_ge *)(auStack_7f0 + lVar43),psVar14);
          if (count != 0) {
            random_fe((secp256k1_fe *)&nums_ge);
            secp256k1_gej_rescale(psVar14,(secp256k1_fe *)&nums_ge);
          }
          _scalar_i = CONCAT44(uStack_14b4,iVar35);
          secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)&nums_ge,&scalar_i);
          secp256k1_ge_set_gej((secp256k1_ge *)&nums_x,(secp256k1_gej *)&nums_ge);
          if (*(int *)((long)groupj[0].y.n + lVar43 + 0x28) != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ;
            pcVar40 = "test condition failed: group[i].infinity == 0";
            uStack_1b00 = 0x1dc;
            goto LAB_0010c33a;
          }
          if (local_1758 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ;
            pcVar40 = "test condition failed: generated.infinity == 0";
            uStack_1b00 = 0x1dd;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_fe_equal_var(&nums_x,(secp256k1_fe *)(auStack_7f0 + lVar43));
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ;
            pcVar40 = "test condition failed: secp256k1_fe_equal_var(&generated.x, &group[i].x)";
            uStack_1b00 = 0x1de;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_fe_equal_var
                            (&local_1788,(secp256k1_fe *)((long)groupj[0].x.n + lVar43 + 0x28));
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ;
            pcVar40 = "test condition failed: secp256k1_fe_equal_var(&generated.y, &group[i].y)";
            uStack_1b00 = 0x1df;
            goto LAB_0010c33a;
          }
          iVar35 = iVar35 + 1;
          psVar29 = psVar14;
        }
        uVar11 = 0;
        psVar13 = group;
        for (lVar43 = 0; lVar43 != 0x548; lVar43 = lVar43 + 0x68) {
          secp256k1_ge_mul_lambda(&nums_ge,(secp256k1_ge *)((long)group[0].x.n + lVar43));
          ge_equals_ge(psVar13 + (uVar11 / 0xd) * -0xd,&nums_ge);
          psVar13 = psVar13 + 9;
          uVar11 = uVar11 + 9;
        }
        iter = 0;
        iVar7 = secp256k1_ge_is_infinity(group);
        if (iVar7 == 0) {
          pcVar31 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
          ;
          pcVar40 = "test condition failed: secp256k1_ge_is_infinity(&group[0])";
          uStack_1b00 = 0x81;
          goto LAB_0010c33a;
        }
        iVar7 = secp256k1_gej_is_infinity(groupj);
        if (iVar7 == 0) {
          pcVar31 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
          ;
          pcVar40 = "test condition failed: secp256k1_gej_is_infinity(&groupj[0])";
          uStack_1b00 = 0x82;
          goto LAB_0010c33a;
        }
        psVar29 = groupj;
        lVar43 = 0x68;
        while( true ) {
          psVar29 = psVar29 + 1;
          if (lVar43 + 0x68 == 0x5b0) break;
          iVar7 = secp256k1_ge_is_infinity((secp256k1_ge *)((long)group[0].x.n + lVar43));
          if (iVar7 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ;
            pcVar40 = "test condition failed: !secp256k1_ge_is_infinity(&group[i])";
            uStack_1b00 = 0x84;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_gej_is_infinity(psVar29);
          lVar43 = lVar43 + 0x68;
          if (iVar7 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ;
            pcVar40 = "test condition failed: !secp256k1_gej_is_infinity(&groupj[i])";
            uStack_1b00 = 0x85;
            goto LAB_0010c33a;
          }
        }
        local_1ac0 = group;
        uVar11 = 0;
        while( true ) {
          if (uVar11 == 0xd) break;
          iVar7 = skip_section(&iter);
          if (iVar7 == 0) {
            secp256k1_fe_inv((secp256k1_fe *)&scalar_i,&groupj[uVar11].z);
            psVar13 = local_1ac0;
            uVar47 = uVar11;
            for (lVar43 = 0; lVar43 != 0x7b8; lVar43 = lVar43 + 0x98) {
              psVar18 = psVar13 + (uVar47 / 0xd) * -0xd;
              psVar29 = (secp256k1_gej *)((long)groupj[0].x.n + lVar43);
              secp256k1_gej_add_var
                        ((secp256k1_gej *)&nums_ge,psVar29,groupj + uVar11,(secp256k1_fe *)0xd);
              ge_equals_gej(psVar18,(secp256k1_gej *)&nums_ge);
              if (uVar11 != 0) {
                secp256k1_gej_add_ge((secp256k1_gej *)&nums_ge,psVar29,group + uVar11);
                ge_equals_gej(psVar18,(secp256k1_gej *)&nums_ge);
              }
              secp256k1_gej_add_ge_var
                        ((secp256k1_gej *)&nums_ge,psVar29,group + uVar11,(secp256k1_fe *)0x0);
              ge_equals_gej(psVar18,(secp256k1_gej *)&nums_ge);
              local_1758 = groupj[uVar11].infinity;
              nums_x.n[4] = groupj[uVar11].x.n[4];
              nums_x.magnitude = groupj[uVar11].x.magnitude;
              nums_x.normalized = groupj[uVar11].x.normalized;
              nums_x.n[2] = groupj[uVar11].x.n[2];
              nums_x.n[3] = groupj[uVar11].x.n[3];
              nums_x.n[0] = groupj[uVar11].x.n[0];
              nums_x.n[1] = groupj[uVar11].x.n[1];
              local_1788.n[0] = groupj[uVar11].y.n[0];
              local_1788.n[1] = groupj[uVar11].y.n[1];
              local_1788.n[2]._0_4_ = (undefined4)groupj[uVar11].y.n[2];
              local_1788.n[2]._4_4_ = *(undefined4 *)((long)groupj[uVar11].y.n + 0x14);
              local_1788.n[3]._0_4_ = (undefined4)groupj[uVar11].y.n[3];
              local_1788.n[3]._4_4_ = *(undefined4 *)((long)groupj[uVar11].y.n + 0x1c);
              local_1788.n[4]._0_4_ = (undefined4)groupj[uVar11].y.n[4];
              local_1788.n[4]._4_4_ = *(undefined4 *)((long)groupj[uVar11].y.n + 0x24);
              local_1788.magnitude = groupj[uVar11].y.magnitude;
              local_1788.normalized = groupj[uVar11].y.normalized;
              secp256k1_gej_add_zinv_var
                        ((secp256k1_gej *)&nums_ge,psVar29,(secp256k1_ge *)&nums_x,
                         (secp256k1_fe *)&scalar_i);
              ge_equals_gej(psVar18,(secp256k1_gej *)&nums_ge);
              psVar13 = psVar13 + 1;
              uVar47 = uVar47 + 1;
            }
          }
          uVar11 = uVar11 + 1;
          local_1ac0 = local_1ac0 + 1;
        }
        psVar29 = groupj;
        uVar27 = 0;
        for (uVar11 = 0; uVar11 != 0xd; uVar11 = uVar11 + 1) {
          secp256k1_gej_double((secp256k1_gej *)&nums_ge,psVar29);
          uVar33 = uVar27 - 0xd;
          if (uVar11 < 7) {
            uVar33 = uVar27;
          }
          ge_equals_gej(group + uVar33,(secp256k1_gej *)&nums_ge);
          secp256k1_gej_double_var((secp256k1_gej *)&nums_ge,psVar29,(secp256k1_fe *)0x0);
          ge_equals_gej(group + uVar33,(secp256k1_gej *)&nums_ge);
          uVar27 = uVar27 + 2;
          psVar29 = psVar29 + 1;
        }
        psVar13 = group + 0xc;
        psVar29 = groupj;
        for (lVar43 = 0x68; psVar29 = psVar29 + 1, lVar43 != 0x548; lVar43 = lVar43 + 0x68) {
          secp256k1_ge_neg((secp256k1_ge *)&nums_x,(secp256k1_ge *)((long)group[0].x.n + lVar43));
          ge_equals_ge(psVar13,(secp256k1_ge *)&nums_x);
          secp256k1_gej_neg((secp256k1_gej *)&nums_ge,psVar29);
          ge_equals_gej(psVar13,(secp256k1_gej *)&nums_ge);
          psVar13 = psVar13 + -1;
        }
        iter_1 = 0;
        local_1ad8 = 0x68;
        for (lVar43 = 1; lVar43 != 0xd; lVar43 = lVar43 + 1) {
          local_1ae0 = group;
          for (uVar11 = 0; (int)uVar11 != 0xd; uVar11 = uVar11 + 1) {
            iVar7 = skip_section(&iter_1);
            if (iVar7 == 0) {
              psVar13 = local_1ae0;
              uVar47 = uVar11;
              for (iVar7 = 0; iVar7 != 0xd; iVar7 = iVar7 + 1) {
                nums_x.n[0] = CONCAT44(nums_x.n[0]._4_4_,iVar7);
                _scalar_i = CONCAT44(uStack_14b4,(int)uVar11);
                secp256k1_ecmult((secp256k1_gej *)&nums_ge,groupj + lVar43,
                                 (secp256k1_scalar *)&nums_x,&scalar_i);
                ge_equals_gej(psVar13 + (uVar47 / 0xd) * -0xd,(secp256k1_gej *)&nums_ge);
                psVar13 = (secp256k1_ge *)((long)(psVar13->x).n + local_1ad8);
                uVar47 = uVar47 + lVar43;
              }
            }
            local_1ae0 = local_1ae0 + 1;
          }
          local_1ad8 = local_1ad8 + 0x68;
        }
        for (lVar43 = 0; lVar43 != 0xd; lVar43 = lVar43 + 1) {
          for (lVar28 = 0; lVar28 != 0xd; lVar28 = lVar28 + 1) {
            iVar7 = skip_section(&iter_1);
            if (iVar7 == 0) {
              iter_2 = CONCAT44(iter_2._4_4_,(int)lVar43);
              psVar13 = group + lVar28;
              secp256k1_ecmult_const((secp256k1_gej *)&nums_ge,psVar13,(secp256k1_scalar *)&iter_2);
              psVar18 = group + (ulong)(uint)((int)lVar28 * (int)lVar43) % 0xd;
              ge_equals_gej(psVar18,(secp256k1_gej *)&nums_ge);
              if (lVar28 != 0 && lVar43 != 0) {
                iVar7 = secp256k1_ecmult_const_xonly
                                  ((secp256k1_fe *)&iter,&psVar13->x,(secp256k1_fe *)0x0,
                                   (secp256k1_scalar *)&iter_2,0);
                if (iVar7 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                  ;
                  pcVar40 = "test condition failed: ret";
                  uStack_1b00 = 0xdd;
                  goto LAB_0010c33a;
                }
                iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)&iter,&psVar18->x);
                if (iVar7 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                  ;
                  pcVar40 = 
                  "test condition failed: secp256k1_fe_equal_var(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x)"
                  ;
                  uStack_1b00 = 0xde;
                  goto LAB_0010c33a;
                }
                iVar7 = -0xb;
                do {
                  iVar7 = iVar7 + 1;
                  if (iVar7 == 0) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                    ;
                    pcVar40 = "test condition failed: tries >= 0";
                    uStack_1b00 = 0x52;
                    goto LAB_0010c33a;
                  }
                  random_fe((secp256k1_fe *)&scalar_i);
                  secp256k1_fe_normalize((secp256k1_fe *)&scalar_i);
                  iVar35 = secp256k1_fe_is_zero((secp256k1_fe *)&scalar_i);
                } while (iVar35 != 0);
                secp256k1_fe_mul(&nums_x,(secp256k1_fe *)&scalar_i,&psVar13->x);
                iVar7 = secp256k1_ecmult_const_xonly
                                  ((secp256k1_fe *)&iter,&nums_x,(secp256k1_fe *)&scalar_i,
                                   (secp256k1_scalar *)&iter_2,0);
                if (iVar7 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                  ;
                  pcVar40 = "test condition failed: ret";
                  uStack_1b00 = 0xe4;
                  goto LAB_0010c33a;
                }
                iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)&iter,&psVar18->x);
                if (iVar7 == 0) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                  ;
                  pcVar40 = 
                  "test condition failed: secp256k1_fe_equal_var(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x)"
                  ;
                  uStack_1b00 = 0xe5;
                  goto LAB_0010c33a;
                }
              }
            }
          }
        }
        iter_2 = 0;
        error_callback = &ctx->error_callback;
        scratch = secp256k1_scratch_create(error_callback,0x1000);
        uVar22 = 0;
        while (uVar22 != 0xd) {
          local_1a20 = uVar22;
          for (local_1a18 = 0; local_1a18 != 0xd; local_1a18 = local_1a18 + 1) {
            uVar22 = 0;
            while (uVar22 != 0xd) {
              lVar43 = 0;
              local_19d0 = uVar22;
              while (lVar43 != 0xd) {
                local_19d8 = lVar43;
                iVar7 = skip_section(&iter_2);
                if (iVar7 == 0) {
                  psVar13 = group + local_19d8;
                  local_1988 = (int)local_19d8 * (int)local_1a20 + (int)local_19d0;
                  puVar39 = (ulong *)0x0;
                  while( true ) {
                    if (puVar39 == (ulong *)0xd) break;
                    nums_ge.x.n[0]._4_4_ = (int)local_1a18;
                    nums_ge.x.n[0]._0_4_ = (int)local_1a20;
                    _g_sc = CONCAT44(uStack_1a84,(int)local_19d0);
                    pvVar25 = (void *)0xd;
                    psVar18 = psVar13;
                    puVar34 = nums_ge.x.n + 1;
                    for (pvVar24 = pvVar25; pvVar24 != (void *)0x0;
                        pvVar24 = (void *)((long)pvVar24 + -1)) {
                      *puVar34 = (psVar18->x).n[0];
                      psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar49 * -0x10 + 8);
                      puVar34 = puVar34 + (ulong)bVar49 * -2 + 1;
                    }
                    psVar18 = group + (long)puVar39;
                    puVar34 = local_1148;
                    for (; pvVar25 != (void *)0x0; pvVar25 = (void *)((long)pvVar25 + -1)) {
                      *puVar34 = (psVar18->x).n[0];
                      psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar49 * -0x10 + 8);
                      puVar34 = puVar34 + (ulong)bVar49 * -2 + 1;
                    }
                    n_points = puVar39;
                    secp256k1_gej_set_infinity((secp256k1_gej *)&scalar_i);
                    if (scratch == (secp256k1_scratch *)0x0) {
LAB_0010b270:
                      secp256k1_ecmult_multi_simple_var
                                ((secp256k1_gej *)&scalar_i,&g_sc,
                                 (secp256k1_ecmult_multi_callback *)&nums_ge,pvVar25,
                                 (size_t)n_points);
                    }
                    else {
                      sVar16 = secp256k1_scratch_max_allocation(error_callback,scratch,6);
                      n_points = &DAT_00118318;
                      pvVar25 = (void *)0x1;
                      uVar11 = 0;
                      do {
                        if (pvVar25 == (void *)0xd) break;
                        if (pvVar25 < (void *)0xd) {
                          uVar47 = *n_points;
                        }
                        else {
                          uVar47 = 0;
                        }
                        uVar30 = (ulong)(byte)(((short)pvVar25 - 0x80U & 0xff) /
                                              (ushort)(byte)((byte)pvVar25 + 1));
                        uVar41 = (0x98L << ((byte)pvVar25 & 0x3f)) + uVar30 * 8 + 0x110;
                        if (sVar16 < uVar41) break;
                        uVar41 = (sVar16 - uVar41) / (uVar30 * 8 + 0x100);
                        uVar30 = uVar47;
                        if (uVar41 < uVar47) {
                          uVar30 = uVar41;
                        }
                        if (uVar11 < uVar30) {
                          uVar11 = uVar30;
                        }
                        n_points = n_points + 1;
                        pvVar25 = (void *)((long)pvVar25 + 1);
                      } while (uVar47 <= uVar41);
                      if ((uVar11 == 0) ||
                         (sVar16 = secp256k1_scratch_max_allocation(error_callback,scratch,5),
                         sVar16 < 0x70c)) goto LAB_0010b270;
                      local_1a98 = (ulong)(sVar16 - 0xe18 < 0xfffffffffffff8f4);
                      uVar11 = 2;
                      local_1aa0 = (char **)(2 - local_1a98);
                      uVar47 = local_1a98 + 1;
                      ppcVar37 = (char **)0x0;
                      while( true ) {
                        if (ppcVar37 == local_1aa0) break;
                        uVar30 = uVar47;
                        if (uVar11 < uVar47) {
                          uVar30 = uVar11;
                        }
                        lVar43 = (long)ppcVar37 << ((byte)local_1a98 & 0x3f);
                        sVar16 = secp256k1_scratch_checkpoint(error_callback,scratch);
                        secp256k1_gej_set_infinity((secp256k1_gej *)&nums_x);
                        psVar29 = (secp256k1_gej *)&g_sc;
                        if ((ppcVar37 == (char **)0x0) ||
                           (psVar14 = (secp256k1_gej *)0x0, psVar29 = psVar14, uVar11 != 0)) {
                          psVar26 = psVar29;
                          psVar14 = (secp256k1_gej *)
                                    secp256k1_scratch_alloc(error_callback,scratch,uVar30 * 0x98);
                          uVar21 = SUB84(psVar26,0);
                          psVar17 = (secp256k1_scalar *)
                                    secp256k1_scratch_alloc(error_callback,scratch,uVar30 * 4);
                          pvVar25 = secp256k1_scratch_alloc(error_callback,scratch,uVar30 * 0xc0);
                          iter_1 = (uint64_t)pvVar25;
                          psVar18 = (secp256k1_ge *)
                                    secp256k1_scratch_alloc(error_callback,scratch,uVar30 * 0x1a0);
                          psStack_1a50 = psVar18;
                          local_1a48 = (secp256k1_strauss_point_state *)
                                       secp256k1_scratch_alloc
                                                 (error_callback,scratch,uVar30 * 0x410);
                          auVar50._0_4_ =
                               -(uint)((int)psVar14 == 0 && (int)((ulong)psVar14 >> 0x20) == 0);
                          auVar50._4_4_ =
                               -(uint)((int)psVar17 == 0 && (int)((ulong)psVar17 >> 0x20) == 0);
                          auVar50._8_4_ =
                               -(uint)((int)pvVar25 == 0 && (int)((ulong)pvVar25 >> 0x20) == 0);
                          auVar50._12_4_ =
                               -(uint)((int)psVar18 == 0 && (int)((ulong)psVar18 >> 0x20) == 0);
                          iVar7 = movmskps(uVar21,auVar50);
                          if ((iVar7 != 0) || (local_1a48 == (secp256k1_strauss_point_state *)0x0))
                          {
                            secp256k1_scratch_apply_checkpoint(error_callback,scratch,sVar16);
                            break;
                          }
                          puVar34 = (&nums_ge)[lVar43].x.n + 1;
                          psVar26 = psVar14;
                          for (sVar45 = 0; uVar30 != sVar45; sVar45 = sVar45 + 1) {
                            psVar17[sVar45] =
                                 *(secp256k1_scalar *)((long)nums_ge.x.n + sVar45 * 4 + lVar43 * 4);
                            puVar38 = puVar34;
                            psVar18 = (secp256k1_ge *)&iter;
                            for (lVar28 = 0xd; lVar28 != 0; lVar28 = lVar28 + -1) {
                              (psVar18->x).n[0] = *puVar38;
                              puVar38 = puVar38 + (ulong)bVar49 * -2 + 1;
                              psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar49 * -0x10 + 8);
                            }
                            secp256k1_gej_set_ge(psVar26,(secp256k1_ge *)&iter);
                            psVar26 = psVar26 + 1;
                            puVar34 = puVar34 + 0xd;
                          }
                          secp256k1_ecmult_strauss_wnaf
                                    ((secp256k1_strauss_state *)&iter_1,(secp256k1_gej *)&nums_x,
                                     uVar30,psVar14,psVar17,(secp256k1_scalar *)psVar29);
                          secp256k1_scratch_apply_checkpoint(error_callback,scratch,sVar16);
                        }
                        secp256k1_gej_add_var
                                  ((secp256k1_gej *)&scalar_i,(secp256k1_gej *)&scalar_i,
                                   (secp256k1_gej *)&nums_x,&psVar14->x);
                        uVar11 = uVar11 - uVar30;
                        ppcVar37 = (char **)((long)ppcVar37 + 1);
                      }
                    }
                    ge_equals_gej(group + (ulong)(uint)((int)puVar39 * (int)local_1a18 + local_1988)
                                          % 0xd,(secp256k1_gej *)&scalar_i);
                    puVar39 = (ulong *)((long)puVar39 + 1);
                  }
                }
                lVar43 = local_19d8 + 1;
              }
              uVar22 = local_19d0 + 1;
            }
          }
          local_1a18 = 0xd;
          uVar22 = local_1a20 + 1;
        }
        secp256k1_scratch_destroy(error_callback,scratch);
        iter = 0;
        for (iVar7 = 1; iVar35 = 1, iVar7 != 0xd; iVar7 = iVar7 + 1) {
          for (; iVar35 != 0xd; iVar35 = iVar35 + 1) {
            iVar8 = skip_section(&iter);
            if (iVar8 == 0) {
              iVar8 = 1;
              do {
                iter_1 = CONCAT44(iter_1._4_4_,iVar8);
                if (0xc < iVar8) break;
                nums_x.n[2] = 0;
                nums_x.n[0] = 0;
                nums_x.n[1] = 0;
                nums_x.n[3] = (ulong)(byte)iVar35 << 0x38;
                local_14a8[0] = '\0';
                local_14a8[1] = '\0';
                local_14a8[2] = '\0';
                local_14a8[3] = '\0';
                local_14a8[4] = '\0';
                local_14a8[5] = '\0';
                local_14a8[6] = '\0';
                local_14a8[7] = '\0';
                _scalar_i = 0;
                uStack_14b0 = 0;
                uStack_14a0 = (ulong)(byte)iVar7 << 0x38;
                psVar23 = &nums_x;
                iVar9 = secp256k1_ecdsa_sign
                                  (ctx,(secp256k1_ecdsa_signature *)&nums_ge,(uchar *)&scalar_i,
                                   (uchar *)psVar23,secp256k1_nonce_function_smallint,&iter_1);
                if (iVar9 != 1) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                  ;
                  pcVar40 = "test condition failed: ret == 1";
                  uStack_1b00 = 0x168;
                  goto LAB_0010c33a;
                }
                secp256k1_ecdsa_signature_load
                          ((secp256k1_context *)&iter_2,&g_sc,(secp256k1_scalar *)&nums_ge,
                           (secp256k1_ecdsa_signature *)psVar23);
                r_from_k(&expected_r,group,(int)iter_1,(int *)psVar23);
                if ((secp256k1_scalar)iter_2 != expected_r) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                  ;
                  pcVar40 = "test condition failed: r == expected_r";
                  uStack_1b00 = 0x16f;
                  goto LAB_0010c33a;
                }
                uVar27 = ((secp256k1_scalar)iter_2 * iVar35 + iVar7) % 0xd;
                if (((g_sc * (int)iter_1) % 0xd != uVar27) &&
                   (((0xd - g_sc) * (int)iter_1) % 0xd != uVar27)) {
                  pcVar31 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                  ;
                  pcVar40 = 
                  "test condition failed: (k * s) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER || (k * (EXHAUSTIVE_TEST_ORDER - s)) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER"
                  ;
                  uStack_1b00 = 0x171;
                  goto LAB_0010c33a;
                }
                bVar48 = iVar8 <= (int)iter_1;
                iVar8 = (int)iter_1 + 1;
              } while (bVar48);
            }
          }
        }
        iter_1 = 0;
        iVar7 = -1;
        uVar27 = 1;
        while( true ) {
          local_1af0 = &nums_x;
          psVar13 = &nums_ge;
          if (uVar27 == 0xd) break;
          local_1a98 = CONCAT44(local_1a98._4_4_,2);
          for (uVar11 = 1; uVar11 != 0xd; uVar11 = uVar11 + 1) {
            iVar35 = (int)local_1a98;
            for (iVar8 = 1; iVar8 != 0xd; iVar8 = iVar8 + 1) {
              uVar47 = uVar11 & 0xffffffff;
              local_1aa0 = (char **)CONCAT44(local_1aa0._4_4_,iVar35);
              lVar43 = 1;
              while( true ) {
                if (lVar43 == 0xd) break;
                iVar9 = skip_section(&iter_1);
                iVar32 = (int)uVar11;
                if (iVar9 == 0) {
                  uVar36 = (uint)(iVar35 + (int)(uVar47 / 0xd) * -0xd) % 0xd;
                  _g_sc = CONCAT44(uStack_1a84,uVar27);
                  iter_2 = CONCAT44(iter_2._4_4_,iVar32);
                  uVar42 = 0;
                  uVar33 = 0;
                  for (iVar9 = 0; iVar9 != 0xd; iVar9 = iVar9 + 1) {
                    r_from_k((secp256k1_scalar *)&nums_ge,group,iVar9,(int *)0xd);
                    if (uVar11 == (uint)nums_ge.x.n[0]) {
                      uVar33 = uVar33 | (uVar42 / 0xd) * 0xd + uVar36 == 0;
                    }
                    uVar36 = uVar36 + iVar7;
                    uVar42 = uVar42 + uVar27;
                  }
                  secp256k1_ecdsa_signature_save
                            ((secp256k1_ecdsa_signature *)&nums_x,(secp256k1_scalar *)&iter_2,&g_sc)
                  ;
                  psVar13 = group + lVar43;
                  psVar18 = &nums_ge;
                  for (lVar28 = 0xd; lVar28 != 0; lVar28 = lVar28 + -1) {
                    (psVar18->x).n[0] = (psVar13->x).n[0];
                    psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar49 * -0x10 + 8);
                    psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar49 * -0x10 + 8);
                  }
                  secp256k1_pubkey_save((secp256k1_pubkey *)&scalar_i,&nums_ge);
                  local_1948 = 0;
                  iter = 0;
                  pvStack_1950 = (void *)0x0;
                  uStack_1940 = (ulong)(byte)iVar8 << 0x38;
                  uVar36 = secp256k1_ecdsa_verify
                                     (ctx,(secp256k1_ecdsa_signature *)&nums_x,(uchar *)&iter,
                                      (secp256k1_pubkey *)&scalar_i);
                  if ((uVar27 < 7 & uVar33) != uVar36) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                    ;
                    pcVar40 = 
                    "test condition failed: should_verify == secp256k1_ecdsa_verify(ctx, &sig, msg32, &pk)"
                    ;
                    uStack_1b00 = 0x14d;
                    goto LAB_0010c33a;
                  }
                }
                lVar43 = lVar43 + 1;
                iVar35 = iVar35 + iVar32;
                uVar47 = (ulong)(uint)((int)uVar47 + iVar32);
              }
              iVar35 = (int)local_1aa0 + 1;
            }
            local_1a98 = CONCAT44(local_1a98._4_4_,(int)local_1a98 + 1);
          }
          uVar27 = uVar27 + 1;
          iVar7 = iVar7 + -1;
        }
        local_1ac0 = (secp256k1_ge *)0x160;
        pubkey = (secp256k1_xonly_pubkey *)&scalar_i;
        local_1ae8 = 0;
        local_1ae0 = (secp256k1_ge *)0x0;
        local_1ab0 = 0xb;
        psVar18 = group;
        for (uVar11 = 1; psVar23 = &nums_x, uVar11 != 0xd; uVar11 = uVar11 + 1) {
          local_1a78 = 0;
          _g_sc = 0;
          uStack_1a80 = 0;
          uStack_1a70 = uVar11 << 0x38;
          iVar7 = secp256k1_keypair_create(ctx,(secp256k1_keypair *)psVar13,(uchar *)&g_sc);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = "test condition failed: secp256k1_keypair_create(ctx, &keypair[i - 1], buf)";
            uStack_1b00 = 0x1f;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_ec_pubkey_create(ctx,(secp256k1_pubkey *)local_1af0,(uchar *)&g_sc);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = "test condition failed: secp256k1_ec_pubkey_create(ctx, &pubkey[i - 1], buf)";
            uStack_1b00 = 0x20;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_keypair_xonly_pub
                            (ctx,pubkey,(int *)((long)&iter_1 + local_1ae8),
                             (secp256k1_keypair *)psVar13);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parities[i - 1], &keypair[i - 1])"
            ;
            uStack_1b00 = 0x23;
            goto LAB_0010c33a;
          }
          output32 = (uchar *)((long)&iter + (long)local_1ae0);
          iVar7 = secp256k1_xonly_pubkey_serialize(ctx,output32,pubkey);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1])"
            ;
            uStack_1b00 = 0x24;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_xonly_pubkey_parse(ctx,pubkey,output32);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_xonly_pubkey_parse(ctx, &xonly_pubkey[i - 1], xonly_pubkey_bytes[i - 1])"
            ;
            goto LAB_0010c676;
          }
          iVar7 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&g_sc,pubkey);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1])"
            ;
            uStack_1b00 = 0x28;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_memcmp_var(output32,&g_sc,0x20);
          if (iVar7 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0";
            uStack_1b00 = 0x29;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_xonly_pubkey_from_pubkey
                            (ctx,pubkey,(int *)&expected_r,(secp256k1_pubkey *)local_1af0);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(ctx, &xonly_pubkey[i - 1], &parity, &pubkey[i - 1])"
            ;
            uStack_1b00 = 0x2c;
            goto LAB_0010c33a;
          }
          if (expected_r != (&sStack_1a5c)[uVar11]) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = "test condition failed: parity == parities[i - 1]";
            uStack_1b00 = 0x2d;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&g_sc,pubkey);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, buf, &xonly_pubkey[i - 1])"
            ;
            uStack_1b00 = 0x2e;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_memcmp_var(output32,&g_sc,0x20);
          if (iVar7 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], buf, 32) == 0";
            uStack_1b00 = 0x2f;
            goto LAB_0010c33a;
          }
          secp256k1_fe_set_b32_mod((secp256k1_fe *)&iter_2,output32);
          iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)&iter_2,&psVar18[1].x);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = "test condition failed: secp256k1_fe_equal_var(&fe, &group[i].x)";
            uStack_1b00 = 0x33;
            goto LAB_0010c33a;
          }
          iter_2 = psVar18[1].y.n[0];
          uStack_1a00 = psVar18[1].y.n[1];
          local_19f8 = (int)psVar18[1].y.n[2];
          uStack_19f4 = *(undefined4 *)((long)psVar18[1].y.n + 0x14);
          uStack_19f0 = (undefined4)psVar18[1].y.n[3];
          uStack_19ec = *(undefined4 *)((long)psVar18[1].y.n + 0x1c);
          local_19e8 = (undefined4)psVar18[1].y.n[4];
          uStack_19e4 = *(undefined4 *)((long)psVar18[1].y.n + 0x24);
          iStack_19e0 = psVar18[1].y.magnitude;
          iStack_19dc = psVar18[1].y.normalized;
          secp256k1_fe_normalize_var((secp256k1_fe *)&iter_2);
          sVar10 = secp256k1_fe_is_odd((secp256k1_fe *)&iter_2);
          if (sVar10 != (&sStack_1a5c)[uVar11]) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
            ;
            pcVar40 = "test condition failed: secp256k1_fe_is_odd(&fe) == parities[i - 1]";
            uStack_1b00 = 0x38;
            goto LAB_0010c33a;
          }
          if (6 < uVar11) {
            iVar7 = secp256k1_memcmp_var(output32,(void *)((long)&iter + (long)local_1ac0),0x20);
            if (iVar7 != 0) {
              pcVar31 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ;
              pcVar40 = 
              "test condition failed: secp256k1_memcmp_var(xonly_pubkey_bytes[i - 1], xonly_pubkey_bytes[EXHAUSTIVE_TEST_ORDER - i - 1], 32) == 0"
              ;
              uStack_1b00 = 0x3c;
              goto LAB_0010c33a;
            }
            if (sVar10 != 1U - *(int *)((long)&iter_1 + local_1ab0 * 4)) {
              pcVar31 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_exhaustive_impl.h"
              ;
              pcVar40 = 
              "test condition failed: parities[i - 1] == 1 - parities[EXHAUSTIVE_TEST_ORDER - i - 1]"
              ;
              uStack_1b00 = 0x3d;
              goto LAB_0010c33a;
            }
          }
          local_1ab0 = local_1ab0 + -1;
          local_1ac0 = (secp256k1_ge *)((long)local_1ac0 + -0x20);
          local_1ae0 = (secp256k1_ge *)((long)local_1ae0 + 0x20);
          local_1ae8 = local_1ae8 + 4;
          pubkey = pubkey + 1;
          local_1af0 = (secp256k1_fe *)(local_1af0[1].n + 2);
          psVar13 = (secp256k1_ge *)&psVar13->infinity;
          psVar18 = psVar18 + 1;
        }
        for (lVar43 = 0; psVar13 = &nums_ge, lVar43 != 0xe0; lVar43 = lVar43 + 0x20) {
          iVar7 = secp256k1_xonly_pubkey_parse
                            (ctx,(secp256k1_xonly_pubkey *)psVar13,invalid_pubkey_bytes[0] + lVar43)
          ;
          if (iVar7 != 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: !secp256k1_xonly_pubkey_parse(ctx, &pk, invalid_pubkey_bytes[i])"
            ;
            uStack_1b00 = 0xc4;
            goto LAB_0010c33a;
          }
        }
        local_1af0 = (secp256k1_fe *)&iter_2;
        psVar17 = &scalar_i;
        for (lVar43 = -0xc; lVar43 != 0; lVar43 = lVar43 + 1) {
          local_1948 = 0;
          iter = 0;
          pvStack_1950 = (void *)0x0;
          uStack_1940 = (ulong)(byte)((char)lVar43 + 0xd) << 0x38;
          iVar7 = secp256k1_keypair_create(ctx,(secp256k1_keypair *)psVar13,(uchar *)&iter);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar40 = "test condition failed: secp256k1_keypair_create(ctx, &keypair[i - 1], buf)";
            uStack_1b00 = 0xcd;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_keypair_xonly_pub
                            (ctx,(secp256k1_xonly_pubkey *)psVar23,(int *)local_1af0,
                             (secp256k1_keypair *)psVar13);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parity[i - 1], &keypair[i - 1])"
            ;
            uStack_1b00 = 0xce;
            goto LAB_0010c33a;
          }
          iVar7 = secp256k1_xonly_pubkey_serialize
                            (ctx,(uchar *)psVar17,(secp256k1_xonly_pubkey *)psVar23);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
            ;
            pcVar40 = 
            "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1])"
            ;
            uStack_1b00 = 0xcf;
            goto LAB_0010c33a;
          }
          psVar17 = psVar17 + 8;
          local_1af0 = (secp256k1_fe *)((long)local_1af0 + 4);
          psVar23 = (secp256k1_fe *)(psVar23[1].n + 2);
          psVar13 = (secp256k1_ge *)&psVar13->infinity;
        }
        iter_5 = 0;
        extraparams.ndata = (void *)0x0;
        extraparams.magic[0] = 0xda;
        extraparams.magic[1] = 'o';
        extraparams.magic[2] = 0xb3;
        extraparams.magic[3] = 0x8c;
        extraparams._4_4_ = 0;
        extraparams.noncefp = (secp256k1_nonce_function_hardened)0x0;
        for (lVar43 = 1; lVar43 != 0xd; lVar43 = lVar43 + 1) {
          iVar7 = 0xd - (int)lVar43;
          if ((&e)[lVar43] == 0) {
            iVar7 = (int)lVar43;
          }
          for (iVar35 = 1; local_1aa4 = iVar35, iVar35 < 0xd; iVar35 = iVar35 + 1) {
            local_1a38 = 0;
            uStack_1a30._0_4_ = 0;
            uStack_1a30._4_4_ = 0;
            local_1a48 = (secp256k1_strauss_point_state *)0x0;
            uStack_1a40 = 0;
            iter_1 = 0;
            psStack_1a50 = (secp256k1_ge *)0x0;
            local_1a28 = 0;
            iVar8 = skip_section(&iter_5);
            if (iVar8 == 0) {
              extraparams.noncefp = secp256k1_hardened_nonce_function_smallint;
              extraparams.ndata = &local_1aa4;
              iVar8 = 0xd - iVar35;
              if ((&e)[iVar35] == 0) {
                iVar8 = iVar35;
              }
              iVar9 = 0;
              while (iVar35 = local_1aa4, iVar9 < 0xd) {
                secp256k1_testrand256((uchar *)&g_sc);
                secp256k1_schnorrsig_challenge
                          (&e,(uchar *)(local_14d8 + (long)local_1aa4 * 4),(uchar *)&g_sc,0x20,
                           (uchar *)(&scalar_i + (lVar43 + -1) * 8));
                uVar11 = (ulong)e;
                if (*(int *)((long)&iter_1 + uVar11 * 4) == 0) {
                  local_19b8 = 0;
                  _expected_r = 0;
                  uStack_19c0 = 0;
                  uStack_19b0 = (ulong)(e * iVar7 + iVar8) % 0xd << 0x38;
                  iVar35 = secp256k1_schnorrsig_sign_custom
                                     (ctx,(uchar *)&iter,(uchar *)&g_sc,0x20,
                                      (secp256k1_keypair *)(&nums_ge.x + lVar43 * 2 + -2),
                                      &extraparams);
                  if (iVar35 == 0) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
                    ;
                    pcVar40 = 
                    "test condition failed: secp256k1_schnorrsig_sign_custom(ctx, sig64, msg32, sizeof(msg32), &keypairs[d - 1], &extraparams)"
                    ;
                    uStack_1b00 = 0xac;
                    goto LAB_0010c33a;
                  }
                  iVar35 = secp256k1_memcmp_var(&iter,local_14d8 + (long)local_1aa4 * 4,0x20);
                  if (iVar35 != 0) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
                    ;
                    pcVar40 = 
                    "test condition failed: secp256k1_memcmp_var(sig64, xonly_pubkey_bytes[k - 1], 32) == 0"
                    ;
                    uStack_1b00 = 0xae;
                    goto LAB_0010c33a;
                  }
                  iVar35 = secp256k1_memcmp_var(local_1938,&expected_r,0x20);
                  if (iVar35 != 0) {
                    pcVar31 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
                    ;
                    pcVar40 = 
                    "test condition failed: secp256k1_memcmp_var(sig64 + 32, expected_s_bytes, 32) == 0"
                    ;
                    uStack_1b00 = 0xb0;
                    goto LAB_0010c33a;
                  }
                  *(undefined4 *)((long)&iter_1 + uVar11 * 4) = 1;
                  iVar9 = iVar9 + 1;
                }
              }
            }
          }
        }
        extraparams.magic[0] = '\0';
        extraparams.magic[1] = '\0';
        extraparams.magic[2] = '\0';
        extraparams.magic[3] = '\0';
        extraparams._4_4_ = 0;
        for (lVar43 = 1; lVar43 != 7; lVar43 = lVar43 + 1) {
          lVar28 = lVar43 + -1;
          lVar46 = lVar28 * 0x20;
          _g_sc = *(uint64_t *)(&scalar_i + lVar28 * 8);
          uStack_1a80 = (&uStack_14b0)[lVar28 * 4];
          local_1a78 = CONCAT44(*(undefined4 *)(local_14a8 + lVar46 + 4),
                                *(undefined4 *)(local_14a8 + lVar46));
          uStack_1a70 = CONCAT44(*(undefined4 *)((long)&uStack_14a0 + lVar46 + 4),
                                 *(undefined4 *)(&uStack_14a0 + lVar28 * 4));
          iVar7 = 0xd - (int)lVar43;
          if ((&e)[lVar43] == 0) {
            iVar7 = (int)lVar43;
          }
          for (uVar11 = 1; uVar11 != 0xe; uVar11 = uVar11 + 1) {
            local_1a38 = 0;
            uStack_1a30._0_4_ = 0;
            uStack_1a30._4_4_ = 0;
            local_1a48 = (secp256k1_strauss_point_state *)0x0;
            uStack_1a40 = 0;
            iter_1 = 0;
            psStack_1a50 = (secp256k1_ge *)0x0;
            local_1a28 = 0;
            iVar35 = skip_section((uint64_t *)&extraparams);
            if (iVar35 == 0) {
              if (uVar11 < 7) {
                lVar46 = uVar11 - 1;
                lVar19 = lVar46 * 0x20;
                local_1948 = CONCAT44(*(undefined4 *)(local_14a8 + lVar19 + 4),
                                      *(undefined4 *)(local_14a8 + lVar19));
                uStack_1940 = CONCAT44(*(undefined4 *)((long)&uStack_14a0 + lVar19 + 4),
                                       *(undefined4 *)(&uStack_14a0 + lVar46 * 4));
                iter = *(uint64_t *)(&scalar_i + lVar46 * 8);
                pvStack_1950 = (void *)(&uStack_14b0)[lVar46 * 4];
                iVar35 = 0xd - (int)uVar11;
                if ((&e)[uVar11] == 0) {
                  iVar35 = (int)uVar11;
                }
              }
              else {
                local_1948 = secp256k1_ellswift_c3.n[uVar11 * 4 + 2];
                uStack_1940 = secp256k1_ellswift_c3.n[uVar11 * 4 + 3];
                iter = secp256k1_ellswift_c3.n[uVar11 * 4];
                pvStack_1950 = (void *)secp256k1_ellswift_c3.n[uVar11 * 4 + 1];
                iVar35 = -1;
              }
              iVar8 = 0;
LAB_0010c01d:
              while (iVar8 < 0xd) {
                secp256k1_testrand256((uchar *)&expected_r);
                secp256k1_schnorrsig_challenge
                          ((secp256k1_scalar *)&iter_5,(uchar *)&iter,(uchar *)&expected_r,0x20,
                           (uchar *)&g_sc);
                uVar47 = iter_5 & 0xffffffff;
                if (*(int *)((long)&iter_1 + uVar47 * 4) == 0) {
                  iVar9 = (int)iter_5 * iVar7;
                  uVar33 = 0;
                  uVar27 = 0;
                  do {
                    if (uVar27 == 0xe) {
                      secp256k1_testrand256(local_1938);
                      uVar36 = 0;
                    }
                    else {
                      if (uVar27 == 0xf) goto LAB_0010c103;
                      local_1938[0x10] = '\0';
                      local_1938[0x11] = '\0';
                      local_1938[0x12] = '\0';
                      local_1938[0x13] = '\0';
                      local_1938[0x14] = '\0';
                      local_1938[0x15] = '\0';
                      local_1938[0x16] = '\0';
                      local_1938[0x17] = '\0';
                      local_1938[0] = '\0';
                      local_1938[1] = '\0';
                      local_1938[2] = '\0';
                      local_1938[3] = '\0';
                      local_1938[4] = '\0';
                      local_1938[5] = '\0';
                      local_1938[6] = '\0';
                      local_1938[7] = '\0';
                      local_1938._8_8_ = 0;
                      uStack_1920 = (ulong)(byte)uVar27 << 0x38;
                      uVar36 = 0;
                      if (uVar27 != 0xd && iVar35 != -1) {
                        uVar36 = (uint)((uint)(iVar9 + iVar35) % 0xd == uVar27);
                      }
                    }
                    uVar42 = secp256k1_schnorrsig_verify
                                       (ctx,(uchar *)&iter,(uchar *)&expected_r,0x20,
                                        (secp256k1_xonly_pubkey *)((long)&nums_x + lVar28 * 0x40));
                    if (uVar42 != uVar36) {
                      pcVar31 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
                      ;
                      pcVar40 = "test condition failed: valid == expect_valid";
                      uStack_1b00 = 0x7f;
                      goto LAB_0010c33a;
                    }
                    uVar33 = uVar33 + uVar36;
                    uVar27 = uVar27 + 1;
                  } while( true );
                }
              }
            }
          }
        }
        psVar13 = group;
        for (lVar43 = -0xc; psVar13 = psVar13 + 1, lVar43 != 0; lVar43 = lVar43 + 1) {
          local_1948 = 0;
          iter = 0;
          pvStack_1950 = (void *)0x0;
          uStack_1940 = (ulong)(byte)((char)lVar43 + 0xd) << 0x38;
          iVar7 = secp256k1_ellswift_create(ctx,(uchar *)&nums_x,(uchar *)&iter,(uchar *)0x0);
          if (iVar7 == 0) {
            pcVar31 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ellswift/tests_exhaustive_impl.h"
            ;
            pcVar40 = "test condition failed: secp256k1_ellswift_create(ctx, ell64, sec32, NULL)";
            uStack_1b00 = 0x1e;
            goto LAB_0010c33a;
          }
          secp256k1_ellswift_decode(ctx,(secp256k1_pubkey *)&scalar_i,(uchar *)&nums_x);
          secp256k1_pubkey_load(ctx,&nums_ge,(secp256k1_pubkey *)&scalar_i);
          ge_equals_ge(&nums_ge,psVar13);
        }
        secp256k1_context_destroy(ctx);
      }
      pcVar31 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
      ;
      pcVar40 = "test condition failed: secp256k1_context_randomize(ctx, rand32)";
      uStack_1b00 = 0x1c2;
    }
  }
LAB_0010c33a:
  fprintf(_stderr,"%s:%d: %s\n",pcVar31,uStack_1b00,pcVar40);
  abort();
code_r0x0010a7a2:
  psVar18 = psVar18 + -1;
  iVar7 = *piVar15;
  piVar15 = piVar15 + -0x26;
  if (iVar7 == 0) goto code_r0x0010a7b2;
  goto LAB_0010a799;
code_r0x0010a7b2:
  secp256k1_fe_mul(&psVar13[lVar43].x,&psVar18->x,(secp256k1_fe *)&scalar_i);
  secp256k1_fe_mul((secp256k1_fe *)&scalar_i,(secp256k1_fe *)&scalar_i,&psVar14[lVar43].z);
  lVar43 = -lVar28;
  goto LAB_0010a783;
LAB_0010c103:
  if (uVar33 != (iVar35 != -1)) {
    pcVar31 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_exhaustive_impl.h"
    ;
    pcVar40 = "test condition failed: count_valid == (actual_k != -1)";
    uStack_1b00 = 0x83;
    goto LAB_0010c33a;
  }
  *(undefined4 *)((long)&iter_1 + uVar47 * 4) = 1;
  iVar8 = iVar8 + 1;
  goto LAB_0010c01d;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_gej groupj[EXHAUSTIVE_TEST_ORDER];
    secp256k1_ge group[EXHAUSTIVE_TEST_ORDER];
    unsigned char rand32[32];
    secp256k1_context *ctx;

    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    printf("Exhaustive tests for order %lu\n", (unsigned long)EXHAUSTIVE_TEST_ORDER);

    /* find iteration count */
    if (argc > 1) {
        count = strtol(argv[1], NULL, 0);
    }
    printf("test count = %i\n", count);

    /* find random seed */
    secp256k1_testrand_init(argc > 2 ? argv[2] : NULL);

    /* set up split processing */
    if (argc > 4) {
        num_cores = strtol(argv[3], NULL, 0);
        this_core = strtol(argv[4], NULL, 0);
        if (num_cores < 1 || this_core >= num_cores) {
            fprintf(stderr, "Usage: %s [count] [seed] [numcores] [thiscore]\n", argv[0]);
            return 1;
        }
        printf("running tests for core %lu (out of [0..%lu])\n", (unsigned long)this_core, (unsigned long)num_cores - 1);
    }

    /* Recreate the ecmult{,_gen} tables using the right generator (as selected via EXHAUSTIVE_TEST_ORDER) */
    secp256k1_ecmult_gen_compute_table(&secp256k1_ecmult_gen_prec_table[0][0], &secp256k1_ge_const_g, ECMULT_GEN_PREC_BITS);
    secp256k1_ecmult_compute_two_tables(secp256k1_pre_g, secp256k1_pre_g_128, WINDOW_G, &secp256k1_ge_const_g);

    while (count--) {
        /* Build context */
        ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
        secp256k1_testrand256(rand32);
        CHECK(secp256k1_context_randomize(ctx, rand32));

        /* Generate the entire group */
        secp256k1_gej_set_infinity(&groupj[0]);
        secp256k1_ge_set_gej(&group[0], &groupj[0]);
        for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_gej_add_ge(&groupj[i], &groupj[i - 1], &secp256k1_ge_const_g);
            secp256k1_ge_set_gej(&group[i], &groupj[i]);
            if (count != 0) {
                /* Set a different random z-value for each Jacobian point, except z=1
                   is used in the last iteration. */
                secp256k1_fe z;
                random_fe(&z);
                secp256k1_gej_rescale(&groupj[i], &z);
            }

            /* Verify against ecmult_gen */
            {
                secp256k1_scalar scalar_i;
                secp256k1_gej generatedj;
                secp256k1_ge generated;

                secp256k1_scalar_set_int(&scalar_i, i);
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &generatedj, &scalar_i);
                secp256k1_ge_set_gej(&generated, &generatedj);

                CHECK(group[i].infinity == 0);
                CHECK(generated.infinity == 0);
                CHECK(secp256k1_fe_equal_var(&generated.x, &group[i].x));
                CHECK(secp256k1_fe_equal_var(&generated.y, &group[i].y));
            }
        }

        /* Run the tests */
        test_exhaustive_endomorphism(group);
        test_exhaustive_addition(group, groupj);
        test_exhaustive_ecmult(group, groupj);
        test_exhaustive_ecmult_multi(ctx, group);
        test_exhaustive_sign(ctx, group);
        test_exhaustive_verify(ctx, group);

#ifdef ENABLE_MODULE_RECOVERY
        test_exhaustive_recovery(ctx, group);
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
        test_exhaustive_extrakeys(ctx, group);
#endif
#ifdef ENABLE_MODULE_SCHNORRSIG
        test_exhaustive_schnorrsig(ctx);
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    /* The ellswift algorithm does have additional edge cases when operating on
     * curves of even order, which are not included in the code as secp256k1 is
     * of odd order. Skip the ellswift tests if the used exhaustive tests curve
     * is even-ordered accordingly. */
    #if !EXHAUSTIVE_TEST_CURVE_HAS_EVEN_ORDER
        test_exhaustive_ellswift(ctx, group);
    #endif
#endif

        secp256k1_context_destroy(ctx);
    }

    secp256k1_testrand_finish();

    printf("no problems found\n");
    return 0;
}